

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O2

void __thiscall
asio::basic_socket<asio::ip::tcp,asio::any_io_executor>::initiate_async_connect::operator()
          (initiate_async_connect *this,function<void_(const_std::error_code_&)> *handler,
          endpoint_type *peer_endpoint,error_code *open_ec)

{
  long lVar1;
  undefined8 *puVar2;
  non_const_lvalue<std::function<void_(const_std::error_code_&)>_&> handler2;
  binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> bStack_48;
  
  if (open_ec->_M_value == 0) {
    std::function<void_(const_std::error_code_&)>::function(&bStack_48.handler_,handler);
    puVar2 = *(undefined8 **)this;
    detail::reactive_socket_service<asio::ip::tcp>::
    async_connect<std::function<void(std::error_code_const&)>,asio::any_io_executor>
              ((reactive_socket_service<asio::ip::tcp> *)*puVar2,(implementation_type *)(puVar2 + 1)
               ,peer_endpoint,&bStack_48.handler_,(any_io_executor *)(puVar2 + 4));
  }
  else {
    lVar1 = *(long *)this;
    std::function<void_(const_std::error_code_&)>::function(&bStack_48.handler_,handler);
    bStack_48.arg1_._M_value = open_ec->_M_value;
    bStack_48.arg1_._4_4_ = *(undefined4 *)&open_ec->field_0x4;
    bStack_48.arg1_._M_cat = open_ec->_M_cat;
    post<asio::any_io_executor,_asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
              ((any_io_executor *)(lVar1 + 0x20),&bStack_48,0);
  }
  std::_Function_base::~_Function_base((_Function_base *)&bStack_48);
  return;
}

Assistant:

void operator()(ConnectHandler&& handler,
        const endpoint_type& peer_endpoint,
        const asio::error_code& open_ec) const
    {
      // If you get an error on the following line it means that your handler
      // does not meet the documented type requirements for a ConnectHandler.
      ASIO_CONNECT_HANDLER_CHECK(ConnectHandler, handler) type_check;

      if (open_ec)
      {
          asio::post(self_->impl_.get_executor(),
              asio::detail::bind_handler(
                static_cast<ConnectHandler&&>(handler), open_ec));
      }
      else
      {
        detail::non_const_lvalue<ConnectHandler> handler2(handler);
        self_->impl_.get_service().async_connect(
            self_->impl_.get_implementation(), peer_endpoint,
            handler2.value, self_->impl_.get_executor());
      }
    }